

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O1

void __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_53::IntDigits::PrintAsDec
          (IntDigits *this,uint128 v,bool add_neg)

{
  char *pcVar1;
  char *pcVar2;
  uint128 uVar3;
  
  pcVar1 = &this->field_0x3d;
  do {
    pcVar2 = pcVar1;
    uVar3 = (uint128)__udivti3(v.lo_,v.hi_,100,0);
    numbers_internal::PutTwoDigits((int)v.lo_ + (int)uVar3.lo_ * -100,pcVar2 + -3);
    pcVar1 = pcVar2 + -2;
    v = uVar3;
  } while (uVar3.lo_ != 0 || uVar3.hi_ != 0);
  pcVar1 = pcVar2 + -3;
  if (pcVar2[-3] == '0') {
    pcVar1 = pcVar2 + -2;
  }
  if (add_neg) {
    pcVar1[-1] = '-';
    pcVar1 = pcVar1 + -1;
  }
  this->size_ = (long)this + (0x3c - (long)pcVar1);
  this->start_ = pcVar1;
  return;
}

Assistant:

void PrintAsDec(uint128 v, bool add_neg = false) {
    // This function can be sped up if needed. We can call FastIntToBuffer
    // twice, or fix FastIntToBuffer to support uint128.
    char *p = storage_ + sizeof(storage_);
    do {
      p -= 2;
      numbers_internal::PutTwoDigits(static_cast<uint32_t>(v % 100), p);
      v /= 100;
    } while (v);
    if (p[0] == '0') {
      // We printed one too many hexits.
      ++p;
    }
    if (add_neg) {
      *--p = '-';
    }
    size_ = static_cast<size_t>(storage_ + sizeof(storage_) - p);
    start_ = p;
  }